

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O0

generic_param_guard __thiscall
cppwinrt::writer::push_generic_params
          (writer *this,pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *params)

{
  bool bVar1;
  GenericParam *pGVar2;
  pointer in_RDX;
  string_view sVar3;
  allocator<char> local_a5 [13];
  string_view local_98;
  value_type local_88;
  const_reference local_68;
  value_type *param;
  GenericParam __end2;
  GenericParam __begin2;
  pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *params_local;
  writer *this_local;
  
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_RDX;
  bVar1 = winmd::reader::empty<winmd::reader::GenericParam>
                    ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)in_RDX);
  if (bVar1) {
    generic_param_guard::generic_param_guard((generic_param_guard *)this,(writer *)0x0);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
    pGVar2 = winmd::reader::begin<winmd::reader::GenericParam>
                       ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)
                        names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __end2.super_row_base<winmd::reader::GenericParam>._8_8_ =
         (pGVar2->super_row_base<winmd::reader::GenericParam>).m_table;
    pGVar2 = winmd::reader::end<winmd::reader::GenericParam>
                       ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)
                        names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    param = (value_type *)(pGVar2->super_row_base<winmd::reader::GenericParam>).m_table;
    __end2.super_row_base<winmd::reader::GenericParam>.m_table =
         *(table_base **)&(pGVar2->super_row_base<winmd::reader::GenericParam>).m_index;
    while( true ) {
      bVar1 = winmd::reader::row_base<winmd::reader::GenericParam>::operator!=
                        ((row_base<winmd::reader::GenericParam> *)
                         &__end2.super_row_base<winmd::reader::GenericParam>.m_index,
                         (row_base<winmd::reader::GenericParam> *)&param);
      if (!bVar1) break;
      local_68 = winmd::reader::row_base<winmd::reader::GenericParam>::operator*
                           ((row_base<winmd::reader::GenericParam> *)
                            &__end2.super_row_base<winmd::reader::GenericParam>.m_index);
      sVar3 = winmd::reader::GenericParam::Name(local_68);
      local_98 = sVar3;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_88,&local_98,local_a5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range2,&local_88);
      ::std::__cxx11::string::~string((string *)&local_88);
      ::std::allocator<char>::~allocator(local_a5);
      winmd::reader::row_base<winmd::reader::GenericParam>::operator++
                ((row_base<winmd::reader::GenericParam> *)
                 &__end2.super_row_base<winmd::reader::GenericParam>.m_index);
    }
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::push_back((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&params[4].first.super_row_base<winmd::reader::GenericParam>.m_index,
                (value_type *)&__range2);
    generic_param_guard::generic_param_guard((generic_param_guard *)this,(writer *)params);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
  }
  return (generic_param_guard)this;
}

Assistant:

[[nodiscard]] auto push_generic_params(std::pair<GenericParam, GenericParam> const& params)
        {
            if (empty(params))
            {
                return generic_param_guard{ nullptr };
            }

            std::vector<std::string> names;

            for (auto&& param : params)
            {
                names.push_back(std::string{ param.Name() });
            }

            generic_param_stack.push_back(std::move(names));
            return generic_param_guard{ this };
        }